

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.cpp
# Opt level: O0

void __thiscall
btPerturbedContactResult::addContactPoint
          (btPerturbedContactResult *this,btVector3 *normalOnBInWorld,btVector3 *pointInWorld,
          btScalar orgDepth)

{
  btVector3 *pbVar1;
  btVector3 *v2;
  btVector3 *in_RSI;
  long in_RDI;
  btVector3 bVar2;
  btVector3 endPtOrg;
  btVector3 newNormal;
  btScalar newDepth;
  btVector3 startPt;
  btVector3 endPt;
  btVector3 *in_stack_fffffffffffffdb8;
  btVector3 *in_stack_fffffffffffffdc0;
  btVector3 *in_stack_fffffffffffffdd8;
  btTransform *in_stack_fffffffffffffde0;
  btTransform *this_00;
  undefined4 in_stack_fffffffffffffe00;
  btScalar in_stack_fffffffffffffe04;
  btScalar in_stack_fffffffffffffe08;
  btScalar in_stack_fffffffffffffe0c;
  btTransform *in_stack_fffffffffffffe18;
  btVector3 local_11c;
  btTransform local_10c [2];
  btScalar local_8c [2];
  btScalar abStack_84 [2];
  undefined8 local_7c;
  undefined8 local_74;
  undefined8 local_6c;
  undefined8 local_64;
  btVector3 local_5c;
  btScalar local_4c;
  btVector3 local_48;
  btVector3 local_38 [2];
  btVector3 *local_10;
  
  local_10 = in_RSI;
  btVector3::btVector3(local_38);
  btVector3::btVector3(&local_48);
  btVector3::btVector3(&local_5c);
  if ((*(byte *)(in_RDI + 0xf8) & 1) == 0) {
    ::operator*(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8->m_floats);
    bVar2 = operator+(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_38[0].m_floats._8_8_ = bVar2.m_floats._8_8_;
    local_38[0].m_floats._0_8_ = bVar2.m_floats._0_8_;
    v2 = (btVector3 *)(in_RDI + 0xb8);
    pbVar1 = (btVector3 *)&stack0xfffffffffffffe14;
    btTransform::inverse(in_stack_fffffffffffffe18);
    btTransform::operator*
              ((btTransform *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (btTransform *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    bVar2 = btTransform::operator()(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    local_48.m_floats._8_8_ = bVar2.m_floats._8_8_;
    local_48.m_floats._0_8_ = bVar2.m_floats._0_8_;
    operator-(pbVar1,v2);
    local_4c = btVector3::dot((btVector3 *)&stack0xfffffffffffffe04,local_10);
  }
  else {
    bVar2 = ::operator*(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8->m_floats);
    local_74 = bVar2.m_floats._8_8_;
    local_7c = bVar2.m_floats._0_8_;
    bVar2 = operator+(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_64 = bVar2.m_floats._8_8_;
    local_6c = bVar2.m_floats._0_8_;
    pbVar1 = (btVector3 *)(in_RDI + 0xb8);
    this_00 = local_10c;
    btTransform::inverse(in_stack_fffffffffffffe18);
    btTransform::operator*
              ((btTransform *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (btTransform *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    bVar2 = btTransform::operator()(this_00,pbVar1);
    abStack_84 = bVar2.m_floats._8_8_;
    local_8c = bVar2.m_floats._0_8_;
    local_38[0].m_floats._0_8_ = local_8c;
    local_38[0].m_floats._8_8_ = abStack_84;
    bVar2 = operator-(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_11c.m_floats._8_8_ = bVar2.m_floats._8_8_;
    local_11c.m_floats._0_8_ = bVar2.m_floats._0_8_;
    local_4c = btVector3::dot(&local_11c,local_10);
    ::operator*(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8->m_floats);
    bVar2 = operator+(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_48.m_floats._8_8_ = bVar2.m_floats._8_8_;
    local_48.m_floats._0_8_ = bVar2.m_floats._0_8_;
  }
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x20))
            (local_4c,*(long **)(in_RDI + 0x30),local_10,&local_48);
  return;
}

Assistant:

virtual void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorld,btScalar orgDepth)
	{
		btVector3 endPt,startPt;
		btScalar newDepth;
		btVector3 newNormal;

		if (m_perturbA)
		{
			btVector3 endPtOrg = pointInWorld + normalOnBInWorld*orgDepth;
			endPt = (m_unPerturbedTransform*m_transformA.inverse())(endPtOrg);
			newDepth = (endPt -  pointInWorld).dot(normalOnBInWorld);
			startPt = endPt+normalOnBInWorld*newDepth;
		} else
		{
			endPt = pointInWorld + normalOnBInWorld*orgDepth;
			startPt = (m_unPerturbedTransform*m_transformB.inverse())(pointInWorld);
			newDepth = (endPt -  startPt).dot(normalOnBInWorld);
			
		}

//#define DEBUG_CONTACTS 1
#ifdef DEBUG_CONTACTS
		m_debugDrawer->drawLine(startPt,endPt,btVector3(1,0,0));
		m_debugDrawer->drawSphere(startPt,0.05,btVector3(0,1,0));
		m_debugDrawer->drawSphere(endPt,0.05,btVector3(0,0,1));
#endif //DEBUG_CONTACTS

		
		m_originalManifoldResult->addContactPoint(normalOnBInWorld,startPt,newDepth);
	}